

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_arena.h
# Opt level: O2

void __thiscall
ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::reallocate
          (ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref> *this,size_t size)

{
  Ref *pRVar1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  
  pRVar1 = this->data;
  cashew::ArrayStorage::allocate((ArrayStorage *)this,size);
  uVar2 = this->usedElements;
  for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 1) {
    this->data[uVar3].inst = pRVar1[uVar3].inst;
  }
  return;
}

Assistant:

void reallocate(size_t size) {
    T* old = data;
    static_cast<SubType*>(this)->allocate(size);
    for (size_t i = 0; i < usedElements; i++) {
      data[i] = old[i];
    }
  }